

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_block_cyclic(Integer g_a,Integer *dims)

{
  global_array_t *pgVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set block-cyclic data distribution on array that has been allocated",0);
  }
  if (GA[lVar5].ndim < 1) {
    pnga_error("Cannot set block-cyclic data distribution if array size not set",0);
  }
  if (GA[lVar5].distr_type != 0) {
    pnga_error("Cannot reset block-cyclic data distribution on array that has been set",0);
  }
  pgVar1 = GA;
  GA[lVar5].distr_type = 1;
  lVar2 = (long)pgVar1[lVar5].ndim;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      if (dims[lVar3] < 1) {
        pnga_error("Block dimensions must all be greater than zero",0);
      }
      pgVar1 = GA;
      GA[g_a + 1000].block_dims[lVar3] = dims[lVar3];
      lVar2 = pgVar1[g_a + 1000].dims[lVar3];
      pgVar1[g_a + 1000].num_blocks[lVar3] =
           (lVar2 / dims[lVar3] + 1) - (ulong)(lVar2 % dims[lVar3] == 0);
      lVar3 = lVar3 + 1;
      lVar2 = (long)GA[lVar5].ndim;
      pgVar1 = GA;
    } while (lVar3 < lVar2);
  }
  lVar3 = 1;
  if (0 < lVar2) {
    lVar4 = 0;
    do {
      lVar3 = lVar3 * pgVar1[lVar5].num_blocks[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  pgVar1[lVar5].block_total = lVar3;
  return;
}

Assistant:

void pnga_set_block_cyclic(Integer g_a, Integer *dims)
{
  Integer i, jsize;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set block-cyclic data distribution on array that has been allocated",0);
  if (!(GA[ga_handle].ndim > 0))
    pnga_error("Cannot set block-cyclic data distribution if array size not set",0);
  if (GA[ga_handle].distr_type != REGULAR)
    pnga_error("Cannot reset block-cyclic data distribution on array that has been set",0);
  GA[ga_handle].distr_type = BLOCK_CYCLIC;
  /* evaluate number of blocks in each dimension */
  for (i=0; i<GA[ga_handle].ndim; i++) {
    if (dims[i] < 1)
      pnga_error("Block dimensions must all be greater than zero",0);
    GA[ga_handle].block_dims[i] = dims[i];
    jsize = GA[ga_handle].dims[i]/dims[i];
    if (GA[ga_handle].dims[i]%dims[i] != 0) jsize++;
    GA[ga_handle].num_blocks[i] = jsize;
  }
  jsize = 1;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    jsize *= GA[ga_handle].num_blocks[i];
  }
  GA[ga_handle].block_total = jsize;
}